

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign_fwd.h
# Opt level: O2

type dlib::
     matrix_assign_default<dlib::assignable_ptr_matrix<float>,dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>
               (assignable_ptr_matrix<float> *dest,
               matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
               *src,type alpha,bool add_to)

{
  long lVar1;
  undefined7 in_register_00000011;
  long c;
  long lVar2;
  long lVar3;
  long r;
  long lVar4;
  type tVar5;
  
  if ((int)CONCAT71(in_register_00000011,add_to) == 0) {
    lVar3 = 0;
    lVar4 = 0;
    if ((alpha != 1.0) || (NAN(alpha))) {
      for (; lVar4 < (src->lhs->op).rows; lVar4 = lVar4 + 1) {
        for (lVar2 = 0; lVar2 < (((src->rhs->op).m)->op).rows; lVar2 = lVar2 + 1) {
          tVar5 = matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
                  ::operator()(src,lVar4,lVar2);
          *(float *)((long)dest->ptr + lVar2 * 4 + dest->width * lVar3) = tVar5 * alpha;
        }
        lVar3 = lVar3 + 4;
      }
    }
    else {
      for (; lVar4 < (src->lhs->op).rows; lVar4 = lVar4 + 1) {
        for (lVar2 = 0; lVar2 < (((src->rhs->op).m)->op).rows; lVar2 = lVar2 + 1) {
          tVar5 = matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
                  ::operator()(src,lVar4,lVar2);
          *(type *)((long)dest->ptr + lVar2 * 4 + dest->width * lVar3) = tVar5;
        }
        lVar3 = lVar3 + 4;
      }
    }
  }
  else {
    lVar3 = 0;
    lVar4 = 0;
    if ((alpha != 1.0) || (NAN(alpha))) {
      if ((alpha != -1.0) || (NAN(alpha))) {
        for (; lVar4 < (src->lhs->op).rows; lVar4 = lVar4 + 1) {
          for (lVar2 = 0; lVar2 < (((src->rhs->op).m)->op).rows; lVar2 = lVar2 + 1) {
            tVar5 = matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
                    ::operator()(src,lVar4,lVar2);
            lVar1 = dest->width * lVar3;
            *(float *)((long)dest->ptr + lVar2 * 4 + lVar1) =
                 tVar5 * alpha + *(float *)((long)dest->ptr + lVar2 * 4 + lVar1);
          }
          lVar3 = lVar3 + 4;
        }
      }
      else {
        for (; lVar4 < (src->lhs->op).rows; lVar4 = lVar4 + 1) {
          for (lVar2 = 0; lVar2 < (((src->rhs->op).m)->op).rows; lVar2 = lVar2 + 1) {
            tVar5 = matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
                    ::operator()(src,lVar4,lVar2);
            lVar1 = dest->width * lVar3;
            *(float *)((long)dest->ptr + lVar2 * 4 + lVar1) =
                 *(float *)((long)dest->ptr + lVar2 * 4 + lVar1) - tVar5;
          }
          lVar3 = lVar3 + 4;
        }
      }
    }
    else {
      for (; lVar4 < (src->lhs->op).rows; lVar4 = lVar4 + 1) {
        for (lVar2 = 0; lVar2 < (((src->rhs->op).m)->op).rows; lVar2 = lVar2 + 1) {
          tVar5 = matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
                  ::operator()(src,lVar4,lVar2);
          lVar1 = dest->width * lVar3;
          *(float *)((long)dest->ptr + lVar2 * 4 + lVar1) =
               tVar5 + *(float *)((long)dest->ptr + lVar2 * 4 + lVar1);
        }
        lVar3 = lVar3 + 4;
      }
    }
  }
  return;
}

Assistant:

inline typename disable_if<ma::has_column_major_layout<EXP1> >::type  
    matrix_assign_default (
        EXP1& dest,
        const EXP2& src,
        typename EXP2::type alpha,
        bool add_to
    )
    /*!
        requires
            - src.destructively_aliases(dest) == false
            - dest.nr() == src.nr()
            - dest.nc() == src.nc()
        ensures
            - if (add_to == false) then
                - #dest == alpha*src
            - else
                - #dest == dest + alpha*src
    !*/
    {
        if (add_to)
        {
            if (alpha == static_cast<typename EXP2::type>(1))
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) += src(r,c);
                    }
                }
            }
            else if (alpha == static_cast<typename EXP2::type>(-1))
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) -= src(r,c);
                    }
                }
            }
            else
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) += alpha*src(r,c);
                    }
                }
            }
        }
        else
        {
            if (alpha == static_cast<typename EXP2::type>(1))
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) = src(r,c);
                    }
                }
            }
            else
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) = alpha*src(r,c);
                    }
                }
            }
        }
    }